

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TinyNPY.cpp
# Opt level: O0

type_info * NpyArray::getTypeInfo(char t,size_t s)

{
  size_t s_local;
  pointer_____offset_0x10___ *ppuStack_10;
  char t_local;
  
  switch(t) {
  case 'b':
    ppuStack_10 = (pointer_____offset_0x10___ *)&bool::typeinfo;
    return (type_info *)ppuStack_10;
  case 'c':
    if (s == 8) {
      ppuStack_10 = &std::complex<float>::typeinfo;
      return (type_info *)ppuStack_10;
    }
    if (s == 0x10) {
      ppuStack_10 = &std::complex<double>::typeinfo;
      return (type_info *)ppuStack_10;
    }
    if (s == 0x20) {
      ppuStack_10 = &std::complex<long_double>::typeinfo;
      return (type_info *)ppuStack_10;
    }
    break;
  case 'f':
    if (s == 4) {
      ppuStack_10 = (pointer_____offset_0x10___ *)&float::typeinfo;
      return (type_info *)ppuStack_10;
    }
    if (s == 8) {
      ppuStack_10 = (pointer_____offset_0x10___ *)&double::typeinfo;
      return (type_info *)ppuStack_10;
    }
    if (s == 0x10) {
      ppuStack_10 = (pointer_____offset_0x10___ *)&long_double::typeinfo;
      return (type_info *)ppuStack_10;
    }
    break;
  case 'i':
    switch(s) {
    case 1:
      ppuStack_10 = (pointer_____offset_0x10___ *)&char::typeinfo;
      return (type_info *)ppuStack_10;
    case 2:
      ppuStack_10 = (pointer_____offset_0x10___ *)&short::typeinfo;
      return (type_info *)ppuStack_10;
    default:
      break;
    case 4:
      ppuStack_10 = (pointer_____offset_0x10___ *)&int::typeinfo;
      return (type_info *)ppuStack_10;
    case 8:
      ppuStack_10 = (pointer_____offset_0x10___ *)&long::typeinfo;
      return (type_info *)ppuStack_10;
    case 0x10:
      ppuStack_10 = (pointer_____offset_0x10___ *)&long_long::typeinfo;
      return (type_info *)ppuStack_10;
    }
    break;
  case 'u':
    switch(s) {
    case 1:
      ppuStack_10 = (pointer_____offset_0x10___ *)&unsigned_char::typeinfo;
      return (type_info *)ppuStack_10;
    case 2:
      ppuStack_10 = (pointer_____offset_0x10___ *)&unsigned_short::typeinfo;
      return (type_info *)ppuStack_10;
    default:
      break;
    case 4:
      ppuStack_10 = (pointer_____offset_0x10___ *)&unsigned_int::typeinfo;
      return (type_info *)ppuStack_10;
    case 8:
      ppuStack_10 = (pointer_____offset_0x10___ *)&unsigned_long::typeinfo;
      return (type_info *)ppuStack_10;
    case 0x10:
      ppuStack_10 = (pointer_____offset_0x10___ *)&unsigned_long_long::typeinfo;
      return (type_info *)ppuStack_10;
    }
  }
  ppuStack_10 = (pointer_____offset_0x10___ *)&void::typeinfo;
  return (type_info *)ppuStack_10;
}

Assistant:

const std::type_info& NpyArray::getTypeInfo(char t, size_t s)
{
	switch (t) {
	case 'f': switch (s) {
		case  4: return typeid(float);
		case  8: return typeid(double);
		case 16: return typeid(long double);
		} break;
	case 'i': switch (s) {
		case  1: return typeid(char);
		case  2: return typeid(short);
		case  4: return typeid(int);
		case  8: return typeid(long);
		case 16: return typeid(long long);
		} break;
	case 'u': switch (s) {
		case  1: return typeid(unsigned char);
		case  2: return typeid(unsigned short);
		case  4: return typeid(unsigned int);
		case  8: return typeid(unsigned long);
		case 16: return typeid(unsigned long long);
		} break;
	case 'c': switch (s) {
		case  8: return typeid(std::complex<float>);
		case 16: return typeid(std::complex<double>);
		case 32: return typeid(std::complex<long double>);
		} break;
	case 'b': return typeid(bool);
	}
	return typeid(void);
}